

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O2

void TransformOne_C(int16_t *in,uint8_t *dst)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int aiStack_48 [2];
  int C [16];
  
  for (lVar1 = 0; (int)lVar1 != 8; lVar1 = lVar1 + 2) {
    iVar3 = (int)*(short *)((long)in + lVar1 + 0x10);
    iVar6 = iVar3 + *(short *)((long)in + lVar1);
    iVar3 = *(short *)((long)in + lVar1) - iVar3;
    iVar4 = (int)*(short *)((long)in + lVar1 + 8);
    iVar7 = (int)*(short *)((long)in + lVar1 + 0x18);
    iVar5 = (iVar4 * 0x8a8c >> 0x10) - ((iVar7 * 0x4e7b >> 0x10) + iVar7);
    iVar4 = (iVar7 * 0x8a8c >> 0x10) + (iVar4 * 0x4e7b >> 0x10) + iVar4;
    aiStack_48[lVar1 * 2] = iVar4 + iVar6;
    C[lVar1 * 2 + -1] = iVar5 + iVar3;
    C[lVar1 * 2] = iVar3 - iVar5;
    C[lVar1 * 2 + 1] = iVar6 - iVar4;
  }
  for (lVar1 = 0; (int)lVar1 != 0x10; lVar1 = lVar1 + 4) {
    iVar6 = *(int *)((long)C + lVar1 + 8);
    iVar3 = *(int *)((long)C + lVar1 + 0x18);
    iVar5 = *(int *)((long)aiStack_48 + lVar1) + iVar3 + 4;
    iVar4 = *(int *)((long)C + lVar1 + 0x28);
    iVar2 = (iVar4 * 0x8a8c >> 0x10) + (iVar6 * 0x4e7b >> 0x10) + iVar6;
    iVar7 = (iVar2 + iVar5 >> 3) + (uint)dst[lVar1 * 8];
    if (iVar7 < 1) {
      iVar7 = 0;
    }
    if (0xfe < iVar7) {
      iVar7 = 0xff;
    }
    iVar3 = (*(int *)((long)aiStack_48 + lVar1) + 4) - iVar3;
    iVar4 = (iVar6 * 0x8a8c >> 0x10) - ((iVar4 * 0x4e7b >> 0x10) + iVar4);
    dst[lVar1 * 8] = (uint8_t)iVar7;
    iVar6 = (iVar4 + iVar3 >> 3) + (uint)dst[lVar1 * 8 + 1];
    if (iVar6 < 1) {
      iVar6 = 0;
    }
    if (0xfe < iVar6) {
      iVar6 = 0xff;
    }
    dst[lVar1 * 8 + 1] = (uint8_t)iVar6;
    iVar6 = (iVar3 - iVar4 >> 3) + (uint)dst[lVar1 * 8 + 2];
    if (iVar6 < 1) {
      iVar6 = 0;
    }
    if (0xfe < iVar6) {
      iVar6 = 0xff;
    }
    dst[lVar1 * 8 + 2] = (uint8_t)iVar6;
    iVar6 = (iVar5 - iVar2 >> 3) + (uint)dst[lVar1 * 8 + 3];
    if (iVar6 < 1) {
      iVar6 = 0;
    }
    if (0xfe < iVar6) {
      iVar6 = 0xff;
    }
    dst[lVar1 * 8 + 3] = (uint8_t)iVar6;
  }
  return;
}

Assistant:

static void TransformOne_C(const int16_t* in, uint8_t* dst) {
  int C[4 * 4], *tmp;
  int i;
  tmp = C;
  for (i = 0; i < 4; ++i) {    // vertical pass
    const int a = in[0] + in[8];    // [-4096, 4094]
    const int b = in[0] - in[8];    // [-4095, 4095]
    const int c = MUL2(in[4]) - MUL1(in[12]);   // [-3783, 3783]
    const int d = MUL1(in[4]) + MUL2(in[12]);   // [-3785, 3781]
    tmp[0] = a + d;   // [-7881, 7875]
    tmp[1] = b + c;   // [-7878, 7878]
    tmp[2] = b - c;   // [-7878, 7878]
    tmp[3] = a - d;   // [-7877, 7879]
    tmp += 4;
    in++;
  }
  // Each pass is expanding the dynamic range by ~3.85 (upper bound).
  // The exact value is (2. + (20091 + 35468) / 65536).
  // After the second pass, maximum interval is [-3794, 3794], assuming
  // an input in [-2048, 2047] interval. We then need to add a dst value
  // in the [0, 255] range.
  // In the worst case scenario, the input to clip_8b() can be as large as
  // [-60713, 60968].
  tmp = C;
  for (i = 0; i < 4; ++i) {    // horizontal pass
    const int dc = tmp[0] + 4;
    const int a =  dc +  tmp[8];
    const int b =  dc -  tmp[8];
    const int c = MUL2(tmp[4]) - MUL1(tmp[12]);
    const int d = MUL1(tmp[4]) + MUL2(tmp[12]);
    STORE(0, 0, a + d);
    STORE(1, 0, b + c);
    STORE(2, 0, b - c);
    STORE(3, 0, a - d);
    tmp++;
    dst += BPS;
  }
}